

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_8_aw_d(void)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (byte)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  uVar2 = m68ki_read_imm_16();
  m68ki_write_8_fc((int)(short)uVar2,m68ki_cpu.s_flag | 1,(uint)bVar1);
  m68ki_cpu.n_flag = (uint)bVar1;
  m68ki_cpu.not_z_flag = (uint)bVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_aw_d(void)
{
	uint res = MASK_OUT_ABOVE_8(DY);
	uint ea = EA_AW_8();

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}